

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BigPropertyIndex __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
GetPropertyIndex_EnumerateTTD
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this,
          PropertyRecord *pRecord)

{
  bool bVar1;
  PropertyRecord *local_18;
  PropertyRecord *pRecord_local;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  
  local_18 = pRecord;
  bVar1 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_18,
                     (SimpleDictionaryPropertyDescriptor<unsigned_short> **)&pRecord_local);
  if ((bVar1) &&
     (((ulong)(pRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject & 0x800) == 0)) {
    return (BigPropertyIndex)
           *(ushort *)
            ((long)&(pRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject + 2);
  }
  TTDAbort_unrecoverable_error("We found this during enum so what is going on here?");
}

Assistant:

Js::BigPropertyIndex SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetPropertyIndex_EnumerateTTD(const Js::PropertyRecord* pRecord)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if(propertyMap->TryGetReference(pRecord, &descriptor))
        {
            TTDAssert(!(descriptor->Attributes & PropertyDeleted), "We found this during enum so what is going on here?");

            return (Js::BigPropertyIndex)descriptor->propertyIndex;
        }

        TTDAssert(false, "We found this during enum so what is going on here?");
        return Js::Constants::NoBigSlot;
    }